

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>
                 *this,Index target,Index eventIndex)

{
  node_ptr plVar1;
  Column *pCVar2;
  ulong uVar3;
  ulong uVar4;
  Index source;
  Column_support *pCVar5;
  
  pCVar2 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>
           ::get_column(&this->reducedMatrixR_,target);
  plVar1 = (pCVar2->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  pCVar5 = &pCVar2->column_;
  source = 0xffffffff;
  uVar3 = 0xffffffff;
  if (plVar1 != (node_ptr)pCVar5 && plVar1 != (node_ptr)0x0) {
    uVar4 = (ulong)*(uint *)&(pCVar2->column_).super_type.data_.root_plus_size_.m_header.super_node.
                             prev_[1].next_;
    source = 0xffffffff;
    uVar3 = 0xffffffff;
    if (uVar4 != 0xffffffff) {
      source = (this->pivotToColumnIndex_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4];
      uVar3 = uVar4;
    }
  }
  while( true ) {
    if ((int)uVar3 == -1) {
      return;
    }
    if (source == 0xffffffff) break;
    _reduce_column_by(this,target,source);
    plVar1 = (pCVar5->super_type).data_.root_plus_size_.m_header.super_node.next_;
    source = 0xffffffff;
    uVar3 = 0xffffffff;
    if (plVar1 != (node_ptr)pCVar5 && plVar1 != (node_ptr)0x0) {
      uVar4 = (ulong)*(uint *)&(pCVar2->column_).super_type.data_.root_plus_size_.m_header.
                               super_node.prev_[1].next_;
      source = 0xffffffff;
      uVar3 = 0xffffffff;
      if (uVar4 != 0xffffffff) {
        source = (this->pivotToColumnIndex_).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4];
        uVar3 = uVar4;
      }
    }
  }
  (this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start[uVar3] = target;
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}